

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

WhereTerm *
whereScanInit(WhereScan *pScan,WhereClause *pWC,int iCur,int iColumn,u32 opMask,Index *pIdx)

{
  short sVar1;
  WhereTerm *pWVar2;
  
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  pScan->zCollName = (char *)0x0;
  pScan->pIdxExpr = (Expr *)0x0;
  pScan->idxaff = '\0';
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aiCur[0] = iCur;
  pScan->nEquiv = '\x01';
  pScan->iEquiv = '\x01';
  if (pIdx == (Index *)0x0) {
    if (iColumn != -2) goto LAB_0019962c;
    pWVar2 = (WhereTerm *)0x0;
  }
  else {
    pWVar2 = (WhereTerm *)(long)iColumn;
    sVar1 = pIdx->aiColumn[(long)pWVar2];
    iColumn = (int)sVar1;
    if (iColumn == 0xfffffffe) {
      pScan->pIdxExpr = pIdx->aColExpr->a[(long)pWVar2].pExpr;
      pScan->zCollName = pIdx->azColl[(long)pWVar2];
      pScan->aiColumn[0] = -2;
      pWVar2 = whereScanInitIndexExpr(pScan);
      iColumn = 0xfffffffe;
    }
    else if (sVar1 == pIdx->pTable->iPKey) {
      iColumn = 0xffffffff;
    }
    else if (-1 < sVar1) {
      pScan->idxaff = pIdx->pTable->aCol[(uint)iColumn].affinity;
      pWVar2 = (WhereTerm *)pIdx->azColl[(long)pWVar2];
      pScan->zCollName = (char *)pWVar2;
    }
    if (sVar1 != -2) {
LAB_0019962c:
      pScan->aiColumn[0] = (i16)iColumn;
      pWVar2 = whereScanNext(pScan);
      return pWVar2;
    }
  }
  return pWVar2;
}

Assistant:

static WhereTerm *whereScanInit(
  WhereScan *pScan,       /* The WhereScan object being initialized */
  WhereClause *pWC,       /* The WHERE clause to be scanned */
  int iCur,               /* Cursor to scan for */
  int iColumn,            /* Column to scan for */
  u32 opMask,             /* Operator(s) to scan for */
  Index *pIdx             /* Must be compatible with this index */
){
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  pScan->pIdxExpr = 0;
  pScan->idxaff = 0;
  pScan->zCollName = 0;
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aiCur[0] = iCur;
  pScan->nEquiv = 1;
  pScan->iEquiv = 1;
  if( pIdx ){
    int j = iColumn;
    iColumn = pIdx->aiColumn[j];
    if( iColumn==XN_EXPR ){
      pScan->pIdxExpr = pIdx->aColExpr->a[j].pExpr;
      pScan->zCollName = pIdx->azColl[j];
      pScan->aiColumn[0] = XN_EXPR;
      return whereScanInitIndexExpr(pScan);
    }else if( iColumn==pIdx->pTable->iPKey ){
      iColumn = XN_ROWID;
    }else if( iColumn>=0 ){
      pScan->idxaff = pIdx->pTable->aCol[iColumn].affinity;
      pScan->zCollName = pIdx->azColl[j];
    }
  }else if( iColumn==XN_EXPR ){
    return 0;
  }
  pScan->aiColumn[0] = iColumn;
  return whereScanNext(pScan);
}